

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O1

Result * CoreML::Model::validateGeneric(Result *__return_storage_ptr__,Model *model)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int modelVersion;
  bool bVar2;
  ostream *poVar3;
  long *plVar4;
  long *plVar5;
  size_type *psVar6;
  ModelDescription *interface;
  size_type sVar7;
  _Alloc_hider _Var8;
  string err;
  string __str;
  Result r;
  undefined1 local_210 [8];
  _Alloc_hider local_208;
  undefined1 local_200 [24];
  long *local_1e8;
  long local_1e0;
  long local_1d8;
  long lStack_1d0;
  long *local_1c8 [2];
  long local_1b8 [2];
  undefined1 local_1a8 [8];
  _Alloc_hider local_1a0;
  undefined1 local_198 [112];
  ios_base local_128 [264];
  
  modelVersion = model->specificationversion_;
  if (modelVersion == 0) {
    local_1a8 = (undefined1  [8])local_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"Model specification version field missing or corrupt.","");
    Result::Result(__return_storage_ptr__,INVALID_COMPATIBILITY_VERSION,(string *)local_1a8);
    sVar7 = local_198._0_8_;
    _Var8._M_p = (pointer)local_1a8;
    if (local_1a8 == (undefined1  [8])local_198) {
      return __return_storage_ptr__;
    }
    goto LAB_004e1093;
  }
  if (5 < modelVersion) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"The .mlmodel supplied is of version ",0x24);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_198,model->specificationversion_);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,
               ", intended for a newer version of Xcode. This version of Xcode supports model version "
               ,0x56);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," or earlier.",0xc);
    std::__cxx11::stringbuf::str();
    Result::Result(__return_storage_ptr__,UNSUPPORTED_COMPATIBILITY_VERSION,(string *)local_210);
    if (local_210 != (undefined1  [8])local_200) {
      operator_delete((void *)local_210,local_200._0_8_ + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
    std::ios_base::~ios_base(local_128);
    return __return_storage_ptr__;
  }
  interface = model->description_;
  if (interface == (ModelDescription *)0x0) {
    interface = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  validateModelDescription((Result *)local_1a8,interface,modelVersion);
  bVar2 = Result::good((Result *)local_1a8);
  if (bVar2) {
    if (model->isupdatable_ == true) {
      if (3 < model->specificationversion_) {
        validateCanModelBeUpdatable((Result *)local_210,model);
        local_1a8 = local_210;
        std::__cxx11::string::operator=((string *)&local_1a0,(string *)&local_208);
        if (local_208._M_p != local_200 + 8) {
          operator_delete(local_208._M_p,local_200._8_8_ + 1);
        }
        goto LAB_004e1002;
      }
      local_1c8[0] = local_1b8;
      std::__cxx11::string::_M_construct((ulong)local_1c8,'\x01');
      *(undefined1 *)local_1c8[0] = 0x34;
      plVar4 = (long *)std::__cxx11::string::replace((ulong)local_1c8,0,(char *)0x0,0x6252d3);
      plVar5 = plVar4 + 2;
      if ((long *)*plVar4 == plVar5) {
        local_1d8 = *plVar5;
        lStack_1d0 = plVar4[3];
        local_1e8 = &local_1d8;
      }
      else {
        local_1d8 = *plVar5;
        local_1e8 = (long *)*plVar4;
      }
      local_1e0 = plVar4[1];
      *plVar4 = (long)plVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_1e8);
      psVar6 = (size_type *)(plVar4 + 2);
      if ((size_type *)*plVar4 == psVar6) {
        local_200._0_8_ = *psVar6;
        local_200._8_8_ = plVar4[3];
        local_210 = (undefined1  [8])local_200;
      }
      else {
        local_200._0_8_ = *psVar6;
        local_210 = (undefined1  [8])*plVar4;
      }
      local_208._M_p = (pointer)plVar4[1];
      *plVar4 = (long)psVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if (local_1e8 != &local_1d8) {
        operator_delete(local_1e8,local_1d8 + 1);
      }
      if (local_1c8[0] != local_1b8) {
        operator_delete(local_1c8[0],local_1b8[0] + 1);
      }
      Result::Result(__return_storage_ptr__,INVALID_COMPATIBILITY_VERSION,(string *)local_210);
      if (local_210 != (undefined1  [8])local_200) {
        operator_delete((void *)local_210,local_200._0_8_ + 1);
      }
    }
    else {
LAB_004e1002:
      bVar2 = Result::good((Result *)local_1a8);
      if (!bVar2) goto LAB_004e101d;
      validateOptional(__return_storage_ptr__,model);
    }
  }
  else {
LAB_004e101d:
    __return_storage_ptr__->m_type = local_1a8._0_4_;
    __return_storage_ptr__->m_reason = local_1a8._4_4_;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
    if (local_1a0._M_p == local_198 + 8) {
      paVar1->_M_allocated_capacity = CONCAT71(local_198._9_7_,local_198[8]);
      *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_198._16_8_;
    }
    else {
      (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_1a0._M_p;
      (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
           CONCAT71(local_198._9_7_,local_198[8]);
    }
    (__return_storage_ptr__->m_message)._M_string_length = local_198._0_8_;
    local_198._0_8_ = 0;
    local_198[8] = '\0';
    local_1a0._M_p = local_198 + 8;
  }
  if (local_1a0._M_p == local_198 + 8) {
    return __return_storage_ptr__;
  }
  sVar7 = CONCAT71(local_198._9_7_,local_198[8]);
  _Var8._M_p = local_1a0._M_p;
LAB_004e1093:
  operator_delete(_Var8._M_p,sVar7 + 1);
  return __return_storage_ptr__;
}

Assistant:

Result Model::validateGeneric(const Specification::Model& model) {
        // make sure compat version fields are filled in
        if (model.specificationversion() == 0) {
            return Result(ResultType::INVALID_COMPATIBILITY_VERSION,
                          "Model specification version field missing or corrupt.");
        }

        // check public compatibility version
        // note: this one should always be backward compatible, so use > here
        if (model.specificationversion() > MLMODEL_SPECIFICATION_VERSION) {
            std::stringstream msg;
            msg << "The .mlmodel supplied is of version "
                << model.specificationversion()
                << ", intended for a newer version of Xcode. This version of Xcode supports model version "
                << MLMODEL_SPECIFICATION_VERSION
                << " or earlier.";
            return Result(ResultType::UNSUPPORTED_COMPATIBILITY_VERSION,
                          msg.str());
        }

        // validate model interface
        Result r = validateModelDescription(model.description(), model.specificationversion());
        if (!r.good()) {
            return r;
        }
        
        if (model.isupdatable()){
            if (model.specificationversion() < MLMODEL_SPECIFICATION_VERSION_IOS13) {
                std::string err = "Model specification version for an updatable model must be '" + std::to_string(MLMODEL_SPECIFICATION_VERSION_IOS13) + "' or above.";
                return Result(ResultType::INVALID_COMPATIBILITY_VERSION, err);
            }
            r = validateCanModelBeUpdatable(model);
        }
        if (!r.good()) {
            return r;
        }

        return validateOptional(model);
    }